

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_misc.h
# Opt level: O2

int mbedtls_ssl_sig_alg_is_supported(mbedtls_ssl_context *ssl,uint16_t sig_alg)

{
  uint uVar1;
  
  uVar1 = 0;
  if (ssl->tls_version == MBEDTLS_SSL_VERSION_TLS1_2) {
    uVar1 = (uint)((char)sig_alg == '\x03' && (byte)((char)(sig_alg >> 8) - 3U) < 2);
  }
  return uVar1;
}

Assistant:

static inline int mbedtls_ssl_sig_alg_is_supported(
    const mbedtls_ssl_context *ssl,
    const uint16_t sig_alg)
{

#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if (ssl->tls_version == MBEDTLS_SSL_VERSION_TLS1_2) {
        return mbedtls_ssl_tls12_sig_alg_is_supported(sig_alg);
    }
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

#if defined(MBEDTLS_SSL_TLS1_3_KEY_EXCHANGE_MODE_EPHEMERAL_ENABLED)
    if (ssl->tls_version == MBEDTLS_SSL_VERSION_TLS1_3) {
        return mbedtls_ssl_tls13_sig_alg_is_supported(sig_alg);
    }
#endif
    ((void) ssl);
    ((void) sig_alg);
    return 0;
}